

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIndexedStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::TransformFeedbackBufferBindingCase::testTransformFeedback
          (TransformFeedbackBufferBindingCase *this)

{
  CallLogWrapper *this_00;
  long lVar1;
  GLuint feedbackBuffers [2];
  StateQueryMemoryWriteGuard<int> boundBuffer;
  
  this_00 = &(this->super_TransformFeedbackCase).super_ApiCase.super_CallLogWrapper;
  glu::CallLogWrapper::glGenBuffers(this_00,2,feedbackBuffers);
  ApiCase::expectError((ApiCase *)this,0);
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 4) {
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,*(GLuint *)((long)feedbackBuffers + lVar1));
    glu::CallLogWrapper::glBufferData(this_00,0x8c8e,0x10,(void *)0x0,0x88e9);
    glu::CallLogWrapper::glBindBufferBase
              (this_00,0x8c8e,
               *(GLuint *)
                ((long)UniformCase::randomFeatures(unsigned_int)::arrayUsageChoices + lVar1),
               *(GLuint *)((long)feedbackBuffers + lVar1));
    ApiCase::expectError((ApiCase *)this,0);
  }
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 4) {
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
              (&boundBuffer);
    glu::CallLogWrapper::glGetIntegeri_v
              (this_00,0x8c8f,
               *(GLuint *)
                ((long)UniformCase::randomFeatures(unsigned_int)::arrayUsageChoices + lVar1),
               &boundBuffer.m_value);
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
              (&boundBuffer,
               (this->super_TransformFeedbackCase).super_ApiCase.super_TestCase.super_TestCase.
               super_TestNode.m_testCtx);
    checkIntEquals((this->super_TransformFeedbackCase).super_ApiCase.super_TestCase.super_TestCase.
                   super_TestNode.m_testCtx,boundBuffer.m_value,
                   *(GLint *)((long)feedbackBuffers + lVar1));
  }
  glu::CallLogWrapper::glDeleteBuffers(this_00,2,feedbackBuffers);
  return;
}

Assistant:

void testTransformFeedback (void)
	{
		const int feedbackPositionIndex = 0;
		const int feedbackOutputIndex = 1;
		const int feedbackIndex[2] = {feedbackPositionIndex, feedbackOutputIndex};

		// bind bffers

		GLuint feedbackBuffers[2];
		glGenBuffers(2, feedbackBuffers);
		expectError(GL_NO_ERROR);

		for (int ndx = 0; ndx < 2; ++ndx)
		{
			glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, feedbackBuffers[ndx]);
			glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 16, NULL, GL_DYNAMIC_READ);
			glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, feedbackIndex[ndx], feedbackBuffers[ndx]);
			expectError(GL_NO_ERROR);
		}

		// test TRANSFORM_FEEDBACK_BUFFER_BINDING

		for (int ndx = 0; ndx < 2; ++ndx)
		{
			StateQueryMemoryWriteGuard<GLint> boundBuffer;
			glGetIntegeri_v(GL_TRANSFORM_FEEDBACK_BUFFER_BINDING, feedbackIndex[ndx], &boundBuffer);
			boundBuffer.verifyValidity(m_testCtx);
			checkIntEquals(m_testCtx, boundBuffer, feedbackBuffers[ndx]);
		}


		// cleanup

		glDeleteBuffers(2, feedbackBuffers);
	}